

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void __thiscall
wasm::SimplifyLocals<false,_false,_false>::~SimplifyLocals
          (SimplifyLocals<false,_false,_false> *this)

{
  SimplifyLocals<false,_false,_false> *this_local;
  
  ~SimplifyLocals(this);
  operator_delete(this,0x368);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }